

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparator.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_2::BytewiseComparatorImpl::FindShortSuccessor
          (BytewiseComparatorImpl *this,string *key)

{
  byte bVar1;
  long lVar2;
  pointer pcVar3;
  size_type __n;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  __n = 1;
  do {
    if (__n - key->_M_string_length == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
LAB_00558c8e:
      __stack_chk_fail(this);
    }
    pcVar3 = (key->_M_dataplus)._M_p;
    bVar1 = pcVar3[__n - 1];
    this = (BytewiseComparatorImpl *)(ulong)bVar1;
    if (bVar1 != 0xff) {
      this = (BytewiseComparatorImpl *)(ulong)(byte)(bVar1 + 1);
      pcVar3[__n - 1] = bVar1 + 1;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  (key,__n);
        return;
      }
      goto LAB_00558c8e;
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

void FindShortSuccessor(std::string* key) const override {
    // Find first character that can be incremented
    size_t n = key->size();
    for (size_t i = 0; i < n; i++) {
      const uint8_t byte = (*key)[i];
      if (byte != static_cast<uint8_t>(0xff)) {
        (*key)[i] = byte + 1;
        key->resize(i + 1);
        return;
      }
    }
    // *key is a run of 0xffs.  Leave it alone.
  }